

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec != (xmlRegExecCtxtPtr)0x0) {
    if (exec->rollbacks != (xmlRegExecRollback *)0x0) {
      if (exec->counts != (int *)0x0) {
        for (local_14 = 0; local_14 < exec->maxRollbacks; local_14 = local_14 + 1) {
          if (exec->rollbacks[local_14].counts != (int *)0x0) {
            (*xmlFree)(exec->rollbacks[local_14].counts);
          }
        }
      }
      (*xmlFree)(exec->rollbacks);
    }
    if (exec->counts != (int *)0x0) {
      (*xmlFree)(exec->counts);
    }
    if (exec->inputStack != (xmlRegInputTokenPtr)0x0) {
      for (local_18 = 0; local_18 < exec->inputStackNr; local_18 = local_18 + 1) {
        if (exec->inputStack[local_18].value != (xmlChar *)0x0) {
          (*xmlFree)(exec->inputStack[local_18].value);
        }
      }
      (*xmlFree)(exec->inputStack);
    }
    if (exec->errString != (xmlChar *)0x0) {
      (*xmlFree)(exec->errString);
    }
    (*xmlFree)(exec);
  }
  return;
}

Assistant:

void
xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec) {
    if (exec == NULL)
	return;

    if (exec->rollbacks != NULL) {
	if (exec->counts != NULL) {
	    int i;

	    for (i = 0;i < exec->maxRollbacks;i++)
		if (exec->rollbacks[i].counts != NULL)
		    xmlFree(exec->rollbacks[i].counts);
	}
	xmlFree(exec->rollbacks);
    }
    if (exec->counts != NULL)
	xmlFree(exec->counts);
    if (exec->inputStack != NULL) {
	int i;

	for (i = 0;i < exec->inputStackNr;i++) {
	    if (exec->inputStack[i].value != NULL)
		xmlFree(exec->inputStack[i].value);
	}
	xmlFree(exec->inputStack);
    }
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    xmlFree(exec);
}